

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O0

int convolution_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  int iVar1;
  undefined1 local_36;
  undefined1 local_35;
  uint32_t local_34;
  _Bool bypass_1;
  _Bool bypass;
  float *pfStack_30;
  uint32_t size;
  float *fir;
  convolution_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  fir = (float *)segment->data;
  if (field == 1) {
    if ((*value & 1) == 0) {
      segment->mix = convolution_segment_mix;
    }
    else {
      segment->mix = convolution_segment_mix_bypass;
    }
  }
  else {
    data = (convolution_segment_data *)segment;
    segment_local = (mixed_segment *)value;
    value_local._0_4_ = field;
    if (field != 2) {
      if (field != 0x29) {
        if (field != 0x3c) {
          mixed_err(7);
          return 0;
        }
        local_34 = 0xffffffff;
        mixed_buffer_request_read(&stack0xffffffffffffffd0,&local_34,(mixed_buffer *)value);
        iVar1 = update_fir(pfStack_30,local_34,(convolution_segment_data *)fir);
        return iVar1;
      }
      if ((0.0 < *value || *value == 0.0) && (*value <= 1.0)) {
        fir[0x19] = *value;
        if ((fir[0x19] == 0.0) && (!NAN(fir[0x19]))) {
          local_35 = 1;
          iVar1 = convolution_segment_set(1,&local_35,segment);
          return iVar1;
        }
        local_36 = 0;
        iVar1 = convolution_segment_set(1,&local_36,segment);
        return iVar1;
      }
      mixed_err(8);
      return 0;
    }
    if (*value == 0) {
      mixed_err(8);
      return 0;
    }
    fir[0x18] = *value;
    free_fft_window_data((fft_window_data *)(fir + 4));
    iVar1 = make_fft_window_data
                      ((uint32_t)fir[0x1b],4,(uint32_t)fir[0x18],(fft_window_data *)(fir + 4));
    if (iVar1 == 0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int convolution_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct convolution_segment_data *data = (struct convolution_segment_data *)segment->data;
  switch(field){
  case MIXED_SAMPLERATE:
    if(*(uint32_t *)value <= 0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->samplerate = *(uint32_t *)value;
    free_fft_window_data(&data->fft_window_data);
    if(!make_fft_window_data(data->block_size, 4, data->samplerate, &data->fft_window_data)){
      return 0;
    }
    break;
  case MIXED_FIR: {
    float *fir;
    uint32_t size = 0xFFFFFFFF;
    mixed_buffer_request_read(&fir, &size, (struct mixed_buffer *)value);
    return update_fir(fir, size, data);
    break;}
  case MIXED_MIX:
    if(*(float *)value < 0 || 1 < *(float *)value){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->mix = *(float *)value;
    if(data->mix == 0){
      bool bypass = 1;
      return convolution_segment_set(MIXED_BYPASS, &bypass, segment);
    }else{
      bool bypass = 0;
      return convolution_segment_set(MIXED_BYPASS, &bypass, segment);
    }
    break;
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = convolution_segment_mix_bypass;
    }else{
      segment->mix = convolution_segment_mix;
    }
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}